

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_what(wchar_t x,wchar_t y,int *a,wchar_t *c)

{
  wchar_t h;
  wchar_t w;
  wchar_t *c_local;
  int *a_local;
  wchar_t y_local;
  wchar_t x_local;
  
  if ((x < L'\0') || (Term->wid <= x)) {
    y_local = L'\xffffffff';
  }
  else if ((y < L'\0') || (Term->hgt <= y)) {
    y_local = L'\xffffffff';
  }
  else {
    *a = Term->scr->a[y][x];
    *c = Term->scr->c[y][x];
    y_local = L'\0';
  }
  return y_local;
}

Assistant:

errr Term_what(int x, int y, int *a, wchar_t *c)
{
	int w = Term->wid;
	int h = Term->hgt;

	/* Verify location */
	if ((x < 0) || (x >= w)) return (-1);
	if ((y < 0) || (y >= h)) return (-1);

	/* Direct access */
	(*a) = Term->scr->a[y][x];
	(*c) = Term->scr->c[y][x];

	/* Success */
	return (0);
}